

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O1

Flow * __thiscall
wasm::ExpressionRunner<wasm::ModuleRunner>::visitSIMDReplace
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::ModuleRunner> *this,SIMDReplace *curr
          )

{
  array<wasm::Literal,_1UL> *other;
  Literal *__return_storage_ptr___00;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> local_198;
  Literal local_180;
  Literal local_168;
  Literal local_150;
  Literal local_138;
  Literal local_120;
  Literal local_108;
  Literal local_f0;
  undefined1 local_d8 [8];
  Literal value;
  vector<wasm::Literal,_std::allocator<wasm::Literal>_> local_b8;
  size_t local_a0;
  char *pcStack_98;
  Flow local_90;
  undefined1 local_48 [8];
  Literal vec;
  
  visit(&local_90,this,curr->vec);
  if (local_90.breakTo.super_IString.str._M_str == (char *)0x0) {
    if (((long)local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
               super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
               super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
               super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
        local_90.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed != 1) {
LAB_00d2a8b4:
      __assert_fail("values.size() == 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                    ,0x52,"const Literal &wasm::Flow::getSingleValue()");
    }
    other = &local_90.values.super_SmallVector<wasm::Literal,_1UL>.fixed;
    Literal::Literal((Literal *)local_48,other->_M_elems);
    visit((Flow *)local_d8,this,curr->value);
    local_90.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed = (size_t)local_d8;
    Literal::operator=(other->_M_elems,&value);
    local_198.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_198.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_198.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_b8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_b8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_b8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_b8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_b8.super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_198);
    local_90.breakTo.super_IString.str._M_len = local_a0;
    local_90.breakTo.super_IString.str._M_str = pcStack_98;
    std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector(&local_b8);
    Literal::~Literal(&value);
    if (local_90.breakTo.super_IString.str._M_str == (char *)0x0) {
      if (((long)local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
                 super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
                 super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 +
          local_90.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed != 1) goto LAB_00d2a8b4;
      Literal::Literal((Literal *)local_d8,other->_M_elems);
      switch(curr->op) {
      case ReplaceLaneVecI8x16:
        __return_storage_ptr___00 = &local_180;
        Literal::replaceLaneI8x16
                  (__return_storage_ptr___00,(Literal *)local_48,(Literal *)local_d8,curr->index);
        Flow::Flow(__return_storage_ptr__,__return_storage_ptr___00);
        break;
      case ReplaceLaneVecI16x8:
        __return_storage_ptr___00 = &local_168;
        Literal::replaceLaneI16x8
                  (__return_storage_ptr___00,(Literal *)local_48,(Literal *)local_d8,curr->index);
        Flow::Flow(__return_storage_ptr__,__return_storage_ptr___00);
        break;
      case ReplaceLaneVecI32x4:
        __return_storage_ptr___00 = &local_150;
        Literal::replaceLaneI32x4
                  (__return_storage_ptr___00,(Literal *)local_48,(Literal *)local_d8,curr->index);
        Flow::Flow(__return_storage_ptr__,__return_storage_ptr___00);
        break;
      case ReplaceLaneVecI64x2:
        __return_storage_ptr___00 = &local_138;
        Literal::replaceLaneI64x2
                  (__return_storage_ptr___00,(Literal *)local_48,(Literal *)local_d8,curr->index);
        Flow::Flow(__return_storage_ptr__,__return_storage_ptr___00);
        break;
      case ReplaceLaneVecF16x8:
        __return_storage_ptr___00 = &local_120;
        Literal::replaceLaneF16x8
                  (__return_storage_ptr___00,(Literal *)local_48,(Literal *)local_d8,curr->index);
        Flow::Flow(__return_storage_ptr__,__return_storage_ptr___00);
        break;
      case ReplaceLaneVecF32x4:
        __return_storage_ptr___00 = &local_108;
        Literal::replaceLaneF32x4
                  (__return_storage_ptr___00,(Literal *)local_48,(Literal *)local_d8,curr->index);
        Flow::Flow(__return_storage_ptr__,__return_storage_ptr___00);
        break;
      case ReplaceLaneVecF64x2:
        __return_storage_ptr___00 = &local_f0;
        Literal::replaceLaneF64x2
                  (__return_storage_ptr___00,(Literal *)local_48,(Literal *)local_d8,curr->index);
        Flow::Flow(__return_storage_ptr__,__return_storage_ptr___00);
        break;
      default:
        handle_unreachable("invalid op",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-interpreter.h"
                           ,0x4d6);
      }
      Literal::~Literal(__return_storage_ptr___00);
      Literal::~Literal((Literal *)local_d8);
    }
    else {
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
           local_90.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
      Literal::Literal((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                       _M_elems,other->_M_elems);
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_start;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_finish;
      (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
           super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
      super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      (__return_storage_ptr__->breakTo).super_IString.str._M_len =
           local_90.breakTo.super_IString.str._M_len;
      (__return_storage_ptr__->breakTo).super_IString.str._M_str =
           local_90.breakTo.super_IString.str._M_str;
    }
    Literal::~Literal((Literal *)local_48);
  }
  else {
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.usedFixed =
         local_90.values.super_SmallVector<wasm::Literal,_1UL>.usedFixed;
    Literal::Literal((__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.fixed.
                     _M_elems,local_90.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems);
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->values).super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
         super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible.
    super__Vector_base<wasm::Literal,_std::allocator<wasm::Literal>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    (__return_storage_ptr__->breakTo).super_IString.str._M_len =
         local_90.breakTo.super_IString.str._M_len;
    (__return_storage_ptr__->breakTo).super_IString.str._M_str =
         local_90.breakTo.super_IString.str._M_str;
  }
  std::vector<wasm::Literal,_std::allocator<wasm::Literal>_>::~vector
            (&local_90.values.super_SmallVector<wasm::Literal,_1UL>.flexible);
  Literal::~Literal(local_90.values.super_SmallVector<wasm::Literal,_1UL>.fixed._M_elems);
  return __return_storage_ptr__;
}

Assistant:

Flow visitSIMDReplace(SIMDReplace* curr) {
    NOTE_ENTER("SIMDReplace");
    Flow flow = self()->visit(curr->vec);
    if (flow.breaking()) {
      return flow;
    }
    Literal vec = flow.getSingleValue();
    flow = self()->visit(curr->value);
    if (flow.breaking()) {
      return flow;
    }
    Literal value = flow.getSingleValue();
    switch (curr->op) {
      case ReplaceLaneVecI8x16:
        return vec.replaceLaneI8x16(value, curr->index);
      case ReplaceLaneVecI16x8:
        return vec.replaceLaneI16x8(value, curr->index);
      case ReplaceLaneVecI32x4:
        return vec.replaceLaneI32x4(value, curr->index);
      case ReplaceLaneVecI64x2:
        return vec.replaceLaneI64x2(value, curr->index);
      case ReplaceLaneVecF16x8:
        return vec.replaceLaneF16x8(value, curr->index);
      case ReplaceLaneVecF32x4:
        return vec.replaceLaneF32x4(value, curr->index);
      case ReplaceLaneVecF64x2:
        return vec.replaceLaneF64x2(value, curr->index);
    }
    WASM_UNREACHABLE("invalid op");
  }